

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

Maybe<kj::String_&> __thiscall
kj::HashMap<kj::ReadableDirectory_const*,kj::String>::find<kj::ReadableDirectory_const*>
          (HashMap<kj::ReadableDirectory_const*,kj::String> *this,ReadableDirectory **key)

{
  Maybe<kj::HashMap<const_kj::ReadableDirectory_*,_kj::String>::Entry_&> MVar1;
  
  MVar1 = Table<kj::HashMap<kj::ReadableDirectory_const*,kj::String>::Entry,kj::HashIndex<kj::HashMap<kj::ReadableDirectory_const*,kj::String>::Callbacks>>
          ::find<0ul,kj::ReadableDirectory_const*&>
                    ((Table<kj::HashMap<kj::ReadableDirectory_const*,kj::String>::Entry,kj::HashIndex<kj::HashMap<kj::ReadableDirectory_const*,kj::String>::Callbacks>>
                      *)this,key);
  if (MVar1.ptr != (Entry *)0x0) {
    MVar1.ptr = (Entry *)&(MVar1.ptr)->value;
  }
  return (Maybe<kj::String_&>)MVar1.ptr;
}

Assistant:

kj::Maybe<Value&> HashMap<Key, Value>::find(KeyLike&& key) {
  return table.find(key).map([](Entry& e) -> Value& { return e.value; });
}